

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * anon_unknown.dwarf_9601b9::GetScanCommand
                   (string *__return_storage_ptr__,string *cmakeCmd,string *tdi,string *lang,
                   string *ppFile,string *ddiFile)

{
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string *local_40;
  string *ddiFile_local;
  string *ppFile_local;
  string *lang_local;
  string *tdi_local;
  string *cmakeCmd_local;
  
  local_40 = ddiFile;
  ddiFile_local = ppFile;
  ppFile_local = lang;
  lang_local = tdi;
  tdi_local = cmakeCmd;
  cmakeCmd_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_70,cmakeCmd);
  cmAlphaNum::cmAlphaNum(&local_a0," -E cmake_ninja_depends --tdi=");
  cmStrCat<std::__cxx11::string,char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[40],std::__cxx11::string>
            (__return_storage_ptr__,&local_70,&local_a0,lang_local,(char (*) [9])0xc35864,
             ppFile_local,(char (*) [7])0xc35080,ddiFile_local,
             (char (*) [40])" --dep=$DEP_FILE --obj=$OBJ_FILE --ddi=",local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetScanCommand(const std::string& cmakeCmd, const std::string& tdi,
                           const std::string& lang, const std::string& ppFile,
                           const std::string& ddiFile)
{
  return cmStrCat(cmakeCmd, " -E cmake_ninja_depends --tdi=", tdi,
                  " --lang=", lang, " --pp=", ppFile,
                  " --dep=$DEP_FILE --obj=$OBJ_FILE --ddi=", ddiFile);
}